

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int local_40;
  int local_3c;
  int i_1;
  int x;
  int i;
  int local_28;
  int local_24;
  int k;
  int n;
  list<int> l;
  
  l.mSize._4_4_ = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::list<int>::list((list<int> *)&k);
  std::istream::operator>>((istream *)&std::cin,&local_24);
  for (i_1 = 0; i_1 < local_24; i_1 = i_1 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_3c);
    CP::list<int>::push_back((list<int> *)&k,&local_3c);
  }
  std::istream::operator>>((istream *)&std::cin,&local_28);
  for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
    CP::list<int>::shift_left((list<int> *)&k);
    CP::list<int>::check_pointer((list<int> *)&k);
    CP::list<int>::print((list<int> *)&k);
  }
  CP::list<int>::~list((list<int> *)&k);
  return l.mSize._4_4_;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::list<int> l;
  int n,k;
  std::cin >> n;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    l.push_back(x);
  }

  std::cin >> k;
  for (int i = 0;i < k;i++) {
    l.shift_left();
    l.check_pointer();
    l.print();
  }


}